

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::PopulateTcParseFieldAux
          (Reflection *this,TailCallTableInfo *table_info,FieldAux *field_aux)

{
  bool bVar1;
  uint32_t uVar2;
  LogMessage *pLVar3;
  EnumDescriptor *pEVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  pointer pAVar5;
  undefined4 local_71;
  byte local_6d;
  LogMessage local_60;
  Voidify local_49;
  pointer local_48;
  reference local_40;
  AuxEntry *aux_entry;
  const_iterator __end2;
  const_iterator __begin2;
  vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  *__range2;
  FieldAux *field_aux_local;
  TailCallTableInfo *table_info_local;
  Reflection *this_local;
  
  __end2 = std::
           vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
           ::begin(&table_info->aux_entries);
  aux_entry = (AuxEntry *)
              std::
              vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
              ::end(&table_info->aux_entries);
  __range2 = (vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
              *)field_aux;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_google::protobuf::internal::TailCallTableInfo::AuxEntry_*,_std::vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>_>
                                     *)&aux_entry), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_google::protobuf::internal::TailCallTableInfo::AuxEntry_*,_std::vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>_>
               ::operator*(&__end2);
    switch(local_40->type) {
    case kNothing:
      internal::TcParseTableBase::FieldAux::FieldAux((FieldAux *)&local_48);
      (__range2->
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
      )._M_impl.super__Vector_impl_data._M_start = local_48;
      __range2 = (vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                  *)&(__range2->
                     super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
      break;
    case kInlinedStringDonatedOffset:
      *(int *)&(__range2->
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
               )._M_impl.super__Vector_impl_data._M_start =
           (this->schema_).inlined_string_donated_offset_;
      __range2 = (vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                  *)&(__range2->
                     super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
      break;
    case kSplitOffset:
      uVar2 = internal::ReflectionSchema::SplitOffset(&this->schema_);
      *(uint32_t *)
       &(__range2->
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
        )._M_impl.super__Vector_impl_data._M_start = uVar2;
      __range2 = (vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                  *)&(__range2->
                     super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
      break;
    case kSplitSizeof:
      uVar2 = internal::ReflectionSchema::SizeofSplit(&this->schema_);
      *(uint32_t *)
       &(__range2->
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
        )._M_impl.super__Vector_impl_data._M_start = uVar2;
      __range2 = (vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                  *)&(__range2->
                     super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
      break;
    case kSubMessage:
      pAVar5 = (pointer)GetDefaultMessageInstance(this,(local_40->field_1).field);
      (__range2->
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
      )._M_impl.super__Vector_impl_data._M_start = pAVar5;
      __range2 = (vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                  *)&(__range2->
                     super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
      break;
    case kSubTable:
    case kSubMessageWeak:
    case kMessageVerifyFunc:
    case kSelfVerifyFunc:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0xdfa);
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar3,(char (*) [14])"Not supported");
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar3);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_60);
    case kEnumRange:
      (__range2->
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)local_40->field_1;
      __range2 = (vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                  *)&(__range2->
                     super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
      break;
    case kEnumValidator:
      pEVar4 = FieldDescriptor::enum_type((local_40->field_1).field);
      this_00 = DescriptorPool::
                MemoizeProjection<google::protobuf::EnumDescriptor,google::protobuf::Reflection::PopulateTcParseFieldAux(google::protobuf::internal::TailCallTableInfo_const&,google::protobuf::internal::TcParseTableBase::FieldAux*)const::__0>
                          (pEVar4);
      pAVar5 = (pointer)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(this_00);
      (__range2->
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
      )._M_impl.super__Vector_impl_data._M_start = pAVar5;
      __range2 = (vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                  *)&(__range2->
                     super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
      break;
    case kNumericOffset:
      *(uint32_t *)
       &(__range2->
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
        )._M_impl.super__Vector_impl_data._M_start = (local_40->field_1).offset;
      __range2 = (vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                  *)&(__range2->
                     super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
      break;
    case kMapAuxInfo:
      memset(&local_71,0,2);
      memset((void *)((long)&local_71 + 2),0,2);
      local_6d = local_6d & 0xe0;
      *(undefined4 *)
       &(__range2->
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
        )._M_impl.super__Vector_impl_data._M_start = local_71;
      *(byte *)((long)&(__range2->
                       super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                       )._M_impl.super__Vector_impl_data._M_start + 4) = local_6d;
      __range2 = (vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                  *)&(__range2->
                     super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
    }
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::internal::TailCallTableInfo::AuxEntry_*,_std::vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void Reflection::PopulateTcParseFieldAux(
    const internal::TailCallTableInfo& table_info,
    TcParseTableBase::FieldAux* field_aux) const {
  for (const auto& aux_entry : table_info.aux_entries) {
    switch (aux_entry.type) {
      case internal::TailCallTableInfo::kNothing:
        *field_aux++ = {};
        break;
      case internal::TailCallTableInfo::kInlinedStringDonatedOffset:
        field_aux++->offset =
            static_cast<uint32_t>(schema_.inlined_string_donated_offset_);
        break;
      case internal::TailCallTableInfo::kSplitOffset:
        field_aux++->offset = schema_.SplitOffset();
        break;
      case internal::TailCallTableInfo::kSplitSizeof:
        field_aux++->offset = schema_.SizeofSplit();
        break;
      case internal::TailCallTableInfo::kSubTable:
      case internal::TailCallTableInfo::kSubMessageWeak:
      case internal::TailCallTableInfo::kMessageVerifyFunc:
      case internal::TailCallTableInfo::kSelfVerifyFunc:
        ABSL_LOG(FATAL) << "Not supported";
        break;
      case internal::TailCallTableInfo::kMapAuxInfo:
        // TODO: Fix this now that dynamic uses normal map ABIs.
        // Default constructed info, which causes MpMap to call the fallback.
        // DynamicMessage uses DynamicMapField, which uses variant keys and
        // values. TcParser does not support them yet, so mark the field as
        // unsupported to fallback to reflection.
        field_aux++->map_info = internal::MapAuxInfo{};
        break;
      case internal::TailCallTableInfo::kSubMessage:
        field_aux++->message_default_p =
            GetDefaultMessageInstance(aux_entry.field);
        break;
      case internal::TailCallTableInfo::kEnumRange:
        field_aux++->enum_range = {aux_entry.enum_range.first,
                                   aux_entry.enum_range.last};
        break;
      case internal::TailCallTableInfo::kEnumValidator:
        field_aux++->enum_data =
            DescriptorPool::MemoizeProjection(
                aux_entry.field->enum_type(),
                [](auto* e) { return MakeEnumValidatorData(e); })
                .data();
        break;
      case internal::TailCallTableInfo::kNumericOffset:
        field_aux++->offset = aux_entry.offset;
        break;
    }
  }
}